

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall Units_replaceUnits_Test::~Units_replaceUnits_Test(Units_replaceUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, replaceUnits)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    libcellml::UnitsPtr u3 = libcellml::Units::create();

    u1->setName("a_unit");
    u2->setName("b_unit");
    u3->setName("c_unit");

    u1->addUnit(libcellml::Units::StandardUnit::AMPERE, "micro");
    m->addUnits(u1);
    m->addUnits(u2);

    EXPECT_TRUE(m->replaceUnits("b_unit", u3));
    EXPECT_EQ(size_t(2), m->unitsCount());

    libcellml::UnitsPtr u4 = m->takeUnits(1);
    EXPECT_EQ("c_unit", u4->name());
    EXPECT_EQ(size_t(1), m->unitsCount());

    EXPECT_TRUE(m->replaceUnits(0, u4));

    u1 = m->units(0);
    EXPECT_EQ("c_unit", u1->name());
    EXPECT_EQ(size_t(1), m->unitsCount());

    // Replace non-existent units.
    EXPECT_FALSE(m->replaceUnits("d_unit", u2));
    EXPECT_FALSE(m->replaceUnits(5, u1));

    // Replace with pointers
    EXPECT_FALSE(m->replaceUnits(u2, u1));
    EXPECT_TRUE(m->replaceUnits(u1, u2));
    EXPECT_FALSE(m->replaceUnits(u1, u2));
    EXPECT_TRUE(m->replaceUnits(u2, u1));
}